

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.cpp
# Opt level: O3

bool __thiscall Sock::Wait(Sock *this,milliseconds timeout,Event requested,Event *occurred)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  long in_FS_OFFSET;
  EventsPerSock events_per_sock;
  undefined1 local_83;
  undefined1 local_82;
  undefined1 local_81;
  _Hashtable<std::shared_ptr<const_Sock>,_std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>,_std::__detail::_Select1st,_Sock::EqualSharedPtrSock,_Sock::HashSharedPtrSock,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_80;
  Sock *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  ushort local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_013bf878;
  this_00[1]._vptr__Sp_counted_base = (_func_int **)this;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = 2;
  }
  local_38 = (ushort)requested;
  local_48 = this;
  local_40 = this_00;
  std::
  _Hashtable<std::shared_ptr<Sock_const>,std::pair<std::shared_ptr<Sock_const>const,Sock::Events>,std::allocator<std::pair<std::shared_ptr<Sock_const>const,Sock::Events>>,std::__detail::_Select1st,Sock::EqualSharedPtrSock,Sock::HashSharedPtrSock,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::shared_ptr<Sock_const>const,Sock::Events>const*>
            ((_Hashtable<std::shared_ptr<Sock_const>,std::pair<std::shared_ptr<Sock_const>const,Sock::Events>,std::allocator<std::pair<std::shared_ptr<Sock_const>const,Sock::Events>>,std::__detail::_Select1st,Sock::EqualSharedPtrSock,Sock::HashSharedPtrSock,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_80,&local_48,&local_30,0,&local_81,&local_82,&local_83);
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  iVar1 = (*this->_vptr_Sock[0xf])(this,timeout.__r,&local_80);
  if ((occurred != (Event *)0x0 & SUB41(iVar1,0)) != 0) {
    *occurred = *(Event *)((long)&local_80._M_before_begin._M_nxt[3]._M_nxt + 1);
  }
  std::
  _Hashtable<std::shared_ptr<const_Sock>,_std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>,_std::__detail::_Select1st,_Sock::EqualSharedPtrSock,_Sock::HashSharedPtrSock,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_80);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return SUB41(iVar1,0);
  }
  __stack_chk_fail();
}

Assistant:

bool Sock::Wait(std::chrono::milliseconds timeout, Event requested, Event* occurred) const
{
    // We need a `shared_ptr` owning `this` for `WaitMany()`, but don't want
    // `this` to be destroyed when the `shared_ptr` goes out of scope at the
    // end of this function. Create it with a custom noop deleter.
    std::shared_ptr<const Sock> shared{this, [](const Sock*) {}};

    EventsPerSock events_per_sock{std::make_pair(shared, Events{requested})};

    if (!WaitMany(timeout, events_per_sock)) {
        return false;
    }

    if (occurred != nullptr) {
        *occurred = events_per_sock.begin()->second.occurred;
    }

    return true;
}